

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_storage_json_test.cpp
# Opt level: O2

void __thiscall
PersistentStorageJsonTestSuite_GetBorderRouterNotEmpty_Test::TestBody
          (PersistentStorageJsonTestSuite_GetBorderRouterNotEmpty_Test *this)

{
  Status SVar1;
  char *in_R9;
  char *pcVar2;
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  initializer_list<unsigned_char> __l_01;
  allocator local_4f5;
  allocator local_4f4;
  allocator_type local_4f3;
  allocator local_4f2;
  allocator local_4f1;
  allocator local_4f0;
  allocator local_4ef;
  allocator local_4ee;
  allocator local_4ed;
  BorderRouterId newId;
  string local_4e8;
  AssertionResult gtest_ar__7;
  NetworkId local_4a4;
  BorderRouterId local_4a0;
  uchar local_49a [2];
  string local_498;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_478;
  State local_45c;
  State local_458;
  State local_454;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_450;
  AssertionResult gtest_ar__1;
  string local_428;
  string local_408;
  string local_3e8;
  string local_3c8;
  string local_3a8;
  UnixTime local_388;
  UnixTime local_380;
  UnixTime local_378;
  AssertionResult gtest_ar_;
  PersistentStorageJson psj;
  BorderRouter returnValue;
  
  unlink("./tmp/test.tmp");
  std::__cxx11::string::string((string *)&returnValue,"./tmp/test.tmp",(allocator *)&gtest_ar_);
  ot::commissioner::persistent_storage::PersistentStorageJson::PersistentStorageJson
            (&psj,(string *)&returnValue);
  std::__cxx11::string::~string((string *)&returnValue);
  SVar1 = ot::commissioner::persistent_storage::PersistentStorageJson::Open(&psj);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ = SVar1 == kSuccess;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&gtest_ar__7);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&returnValue,(internal *)&gtest_ar_,
               (AssertionResult *)"psj.Open() == PersistentStorage::Status::kSuccess","false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_4e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x182,(char *)returnValue._vptr_BorderRouter);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_4e8,(Message *)&gtest_ar__7);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_4e8);
    std::__cxx11::string::~string((string *)&returnValue);
    if ((long *)CONCAT71(gtest_ar__7._1_7_,gtest_ar__7.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar__7._1_7_,gtest_ar__7.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  ot::commissioner::persistent_storage::BorderRouterId::BorderRouterId(&newId);
  ot::commissioner::persistent_storage::BorderRouterId::BorderRouterId(&local_4a0,0xffffffff);
  ot::commissioner::persistent_storage::NetworkId::NetworkId(&local_4a4,0xffffffff);
  std::__cxx11::string::string((string *)&gtest_ar__7,"1.1.1.2",&local_4ed);
  local_478._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_478._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_478._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_4e8,"th1.x",&local_4ee);
  ot::commissioner::BorderAgent::State::State(&local_454,1,0,1,0,1);
  std::__cxx11::string::string((string *)&local_498,"NetworkId",&local_4ef);
  std::__cxx11::string::string((string *)&local_3a8,"vendor_name",&local_4f0);
  std::__cxx11::string::string((string *)&local_3c8,"model_name",&local_4f1);
  std::__cxx11::string::string((string *)&local_3e8,"vendor_data",&local_4f2);
  local_49a[0] = '\x01';
  local_49a[1] = '\x02';
  __l._M_len = 2;
  __l._M_array = local_49a;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_450,__l,&local_4f3);
  std::__cxx11::string::string((string *)&local_408,"Domain_name",&local_4f4);
  std::__cxx11::string::string((string *)&local_428,anon_var_dwarf_4657bc + 9,&local_4f5);
  ot::commissioner::UnixTime::UnixTime(&local_378,0);
  pcVar2 = (char *)(ulong)(uint)local_454;
  ot::commissioner::BorderAgent::BorderAgent
            ((BorderAgent *)&gtest_ar_,(string *)&gtest_ar__7,0xb,(ByteArray *)&local_478,&local_4e8
             ,local_454,&local_498,0x1011223344556677,&local_3a8,&local_3c8,(Timestamp)0x0,1,
             &local_3e8,(ByteArray *)&local_450,&local_408,'\0',0,&local_428,local_378,0xffff);
  ot::commissioner::persistent_storage::BorderRouter::BorderRouter
            (&returnValue,&local_4a0,&local_4a4,(BorderAgent *)&gtest_ar_);
  SVar1 = ot::commissioner::persistent_storage::PersistentStorageJson::Add(&psj,&returnValue,&newId)
  ;
  gtest_ar__1.success_ = SVar1 == kSuccess;
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  ot::commissioner::persistent_storage::BorderRouter::~BorderRouter(&returnValue);
  ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)&gtest_ar_);
  std::__cxx11::string::~string((string *)&local_428);
  std::__cxx11::string::~string((string *)&local_408);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_450);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::__cxx11::string::~string((string *)&local_498);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_478);
  std::__cxx11::string::~string((string *)&gtest_ar__7);
  if (gtest_ar__1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&returnValue,(internal *)&gtest_ar__1,
               (AssertionResult *)
               "psj.Add(BorderRouter{EMPTY_ID, EMPTY_ID, BorderAgent{\"1.1.1.2\", 11, ByteArray{}, \"th1.x\", BorderAgent::State{1, 0, 1, 0, 1}, \"NetworkId\", 0x1011223344556677ll, \"vendor_name\", \"model_name\", Timestamp{0, 0, 0}, 1, \"vendor_data\", ByteArray{1, 2}, \"Domain_name\", 0, 0, \"\", 0, 0xFFFF}}, newId) == PersistentStorage::Status::kSuccess"
               ,"false","true",pcVar2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__7,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x18b,(char *)returnValue._vptr_BorderRouter);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__7,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__7);
    std::__cxx11::string::~string((string *)&returnValue);
    if ((long *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__1.message_);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ = newId.mId == 0;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&gtest_ar__7);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&returnValue,(internal *)&gtest_ar_,(AssertionResult *)"newId.mId == 0",
               "false","true",pcVar2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_4e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x18c,(char *)returnValue._vptr_BorderRouter);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_4e8,(Message *)&gtest_ar__7);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_4e8);
    std::__cxx11::string::~string((string *)&returnValue);
    if ((long *)CONCAT71(gtest_ar__7._1_7_,gtest_ar__7.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar__7._1_7_,gtest_ar__7.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  ot::commissioner::persistent_storage::BorderRouterId::BorderRouterId(&local_4a0,0xffffffff);
  ot::commissioner::persistent_storage::NetworkId::NetworkId(&local_4a4,0xffffffff);
  std::__cxx11::string::string((string *)&gtest_ar__7,"1.1.1.3",&local_4ed);
  local_478._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_478._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_478._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_4e8,"th1.x",&local_4ee);
  ot::commissioner::BorderAgent::State::State(&local_458,1,0,1,0,1);
  std::__cxx11::string::string((string *)&local_498,"NetworkId",&local_4ef);
  std::__cxx11::string::string((string *)&local_3a8,"vendor_name",&local_4f0);
  std::__cxx11::string::string((string *)&local_3c8,"model_name",&local_4f1);
  std::__cxx11::string::string((string *)&local_3e8,"vendor_data",&local_4f2);
  local_49a[0] = '\x01';
  local_49a[1] = '\x02';
  __l_00._M_len = 2;
  __l_00._M_array = local_49a;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_450,__l_00,&local_4f3);
  std::__cxx11::string::string((string *)&local_408,"Domain_name",&local_4f4);
  std::__cxx11::string::string((string *)&local_428,anon_var_dwarf_4657bc + 9,&local_4f5);
  ot::commissioner::UnixTime::UnixTime(&local_380,0);
  pcVar2 = (char *)(ulong)(uint)local_458;
  ot::commissioner::BorderAgent::BorderAgent
            ((BorderAgent *)&gtest_ar_,(string *)&gtest_ar__7,0xc,(ByteArray *)&local_478,&local_4e8
             ,local_458,&local_498,0x1011223344556677,&local_3a8,&local_3c8,(Timestamp)0x0,1,
             &local_3e8,(ByteArray *)&local_450,&local_408,'\0',0,&local_428,local_380,0xffff);
  ot::commissioner::persistent_storage::BorderRouter::BorderRouter
            (&returnValue,&local_4a0,&local_4a4,(BorderAgent *)&gtest_ar_);
  SVar1 = ot::commissioner::persistent_storage::PersistentStorageJson::Add(&psj,&returnValue,&newId)
  ;
  gtest_ar__1.success_ = SVar1 == kSuccess;
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  ot::commissioner::persistent_storage::BorderRouter::~BorderRouter(&returnValue);
  ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)&gtest_ar_);
  std::__cxx11::string::~string((string *)&local_428);
  std::__cxx11::string::~string((string *)&local_408);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_450);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::__cxx11::string::~string((string *)&local_498);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_478);
  std::__cxx11::string::~string((string *)&gtest_ar__7);
  if (gtest_ar__1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&returnValue,(internal *)&gtest_ar__1,
               (AssertionResult *)
               "psj.Add(BorderRouter{EMPTY_ID, EMPTY_ID, BorderAgent{\"1.1.1.3\", 12, ByteArray{}, \"th1.x\", BorderAgent::State{1, 0, 1, 0, 1}, \"NetworkId\", 0x1011223344556677ll, \"vendor_name\", \"model_name\", Timestamp{0, 0, 0}, 1, \"vendor_data\", ByteArray{1, 2}, \"Domain_name\", 0, 0, \"\", 0, 0xFFFF}}, newId) == PersistentStorage::Status::kSuccess"
               ,"false","true",pcVar2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__7,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x192,(char *)returnValue._vptr_BorderRouter);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__7,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__7);
    std::__cxx11::string::~string((string *)&returnValue);
    if ((long *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__1.message_);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ = newId.mId == 1;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&gtest_ar__7);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&returnValue,(internal *)&gtest_ar_,(AssertionResult *)"newId.mId == 1",
               "false","true",pcVar2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_4e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x193,(char *)returnValue._vptr_BorderRouter);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_4e8,(Message *)&gtest_ar__7);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_4e8);
    std::__cxx11::string::~string((string *)&returnValue);
    if ((long *)CONCAT71(gtest_ar__7._1_7_,gtest_ar__7.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar__7._1_7_,gtest_ar__7.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  ot::commissioner::persistent_storage::BorderRouterId::BorderRouterId(&local_4a0,0xffffffff);
  ot::commissioner::persistent_storage::NetworkId::NetworkId(&local_4a4,0xffffffff);
  std::__cxx11::string::string((string *)&gtest_ar__7,"1.1.1.4",&local_4ed);
  local_478._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_478._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_478._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_4e8,"th1.x",&local_4ee);
  ot::commissioner::BorderAgent::State::State(&local_45c,1,0,1,0,1);
  std::__cxx11::string::string((string *)&local_498,"NetworkId",&local_4ef);
  std::__cxx11::string::string((string *)&local_3a8,"vendor_name",&local_4f0);
  std::__cxx11::string::string((string *)&local_3c8,"model_name",&local_4f1);
  std::__cxx11::string::string((string *)&local_3e8,"vendor_data",&local_4f2);
  local_49a[0] = '\x01';
  local_49a[1] = '\x02';
  __l_01._M_len = 2;
  __l_01._M_array = local_49a;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_450,__l_01,&local_4f3);
  std::__cxx11::string::string((string *)&local_408,"Domain_name",&local_4f4);
  std::__cxx11::string::string((string *)&local_428,anon_var_dwarf_4657bc + 9,&local_4f5);
  ot::commissioner::UnixTime::UnixTime(&local_388,0);
  pcVar2 = (char *)(ulong)(uint)local_45c;
  ot::commissioner::BorderAgent::BorderAgent
            ((BorderAgent *)&gtest_ar_,(string *)&gtest_ar__7,0xd,(ByteArray *)&local_478,&local_4e8
             ,local_45c,&local_498,0x1011223344556677,&local_3a8,&local_3c8,(Timestamp)0x0,1,
             &local_3e8,(ByteArray *)&local_450,&local_408,'\0',0,&local_428,local_388,0xffff);
  ot::commissioner::persistent_storage::BorderRouter::BorderRouter
            (&returnValue,&local_4a0,&local_4a4,(BorderAgent *)&gtest_ar_);
  SVar1 = ot::commissioner::persistent_storage::PersistentStorageJson::Add(&psj,&returnValue,&newId)
  ;
  gtest_ar__1.success_ = SVar1 == kSuccess;
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  ot::commissioner::persistent_storage::BorderRouter::~BorderRouter(&returnValue);
  ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)&gtest_ar_);
  std::__cxx11::string::~string((string *)&local_428);
  std::__cxx11::string::~string((string *)&local_408);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_450);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::__cxx11::string::~string((string *)&local_498);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_478);
  std::__cxx11::string::~string((string *)&gtest_ar__7);
  if (gtest_ar__1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&returnValue,(internal *)&gtest_ar__1,
               (AssertionResult *)
               "psj.Add(BorderRouter{EMPTY_ID, EMPTY_ID, BorderAgent{\"1.1.1.4\", 13, ByteArray{}, \"th1.x\", BorderAgent::State{1, 0, 1, 0, 1}, \"NetworkId\", 0x1011223344556677ll, \"vendor_name\", \"model_name\", Timestamp{0, 0, 0}, 1, \"vendor_data\", ByteArray{1, 2}, \"Domain_name\", 0, 0, \"\", 0, 0xFFFF}}, newId) == PersistentStorage::Status::kSuccess"
               ,"false","true",pcVar2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__7,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x199,(char *)returnValue._vptr_BorderRouter);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__7,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__7);
    std::__cxx11::string::~string((string *)&returnValue);
    if ((long *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__1.message_);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ = newId.mId == 2;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&gtest_ar__7);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&returnValue,(internal *)&gtest_ar_,(AssertionResult *)"newId.mId == 2",
               "false","true",pcVar2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_4e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x19a,(char *)returnValue._vptr_BorderRouter);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_4e8,(Message *)&gtest_ar__7);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_4e8);
    std::__cxx11::string::~string((string *)&returnValue);
    if ((long *)CONCAT71(gtest_ar__7._1_7_,gtest_ar__7.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar__7._1_7_,gtest_ar__7.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  ot::commissioner::persistent_storage::BorderRouter::BorderRouter(&returnValue);
  ot::commissioner::persistent_storage::BorderRouterId::BorderRouterId
            ((BorderRouterId *)&gtest_ar_,3);
  SVar1 = ot::commissioner::persistent_storage::PersistentStorageJson::Get
                    (&psj,(RegistrarId *)&gtest_ar_,&returnValue);
  gtest_ar__7.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar__7.success_ = SVar1 == kNotFound;
  if (!gtest_ar__7.success_) {
    testing::Message::Message((Message *)&local_4e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_,(internal *)&gtest_ar__7,
               (AssertionResult *)
               "psj.Get(BorderRouterId(3), returnValue) == PersistentStorage::Status::kNotFound",
               "false","true",pcVar2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_498,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x19e,(char *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_498,(Message *)&local_4e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_498);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    if ((long *)local_4e8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_4e8._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__7.message_);
  ot::commissioner::persistent_storage::BorderRouterId::BorderRouterId
            ((BorderRouterId *)&gtest_ar_,1);
  SVar1 = ot::commissioner::persistent_storage::PersistentStorageJson::Get
                    (&psj,(RegistrarId *)&gtest_ar_,&returnValue);
  gtest_ar__7.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar__7.success_ = SVar1 == kSuccess;
  if (!gtest_ar__7.success_) {
    testing::Message::Message((Message *)&local_4e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_,(internal *)&gtest_ar__7,
               (AssertionResult *)
               "psj.Get(BorderRouterId(1), returnValue) == PersistentStorage::Status::kSuccess",
               "false","true",pcVar2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_498,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x19f,(char *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_498,(Message *)&local_4e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_498);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    if ((long *)local_4e8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_4e8._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__7.message_);
  gtest_ar__7.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar__7.success_ = returnValue.mId.mId == 1;
  if (!gtest_ar__7.success_) {
    testing::Message::Message((Message *)&local_4e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_,(internal *)&gtest_ar__7,
               (AssertionResult *)"returnValue.mId.mId == 1","false","true",pcVar2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_498,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x1a0,(char *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_498,(Message *)&local_4e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_498);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    if ((long *)local_4e8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_4e8._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__7.message_);
  gtest_ar__7.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar__7.success_ = returnValue.mAgent.mPort == 0xc;
  if (!gtest_ar__7.success_) {
    testing::Message::Message((Message *)&local_4e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_,(internal *)&gtest_ar__7,
               (AssertionResult *)"returnValue.mAgent.mPort == 12","false","true",pcVar2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_498,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x1a1,(char *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_498,(Message *)&local_4e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_498);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    if ((long *)local_4e8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_4e8._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__7.message_);
  gtest_ar__7.success_ = std::operator==(&returnValue.mAgent.mAddr,"1.1.1.3");
  gtest_ar__7.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!gtest_ar__7.success_) {
    testing::Message::Message((Message *)&local_4e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_,(internal *)&gtest_ar__7,
               (AssertionResult *)"returnValue.mAgent.mAddr == \"1.1.1.3\"","false","true",pcVar2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_498,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x1a2,(char *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_498,(Message *)&local_4e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_498);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    if ((long *)local_4e8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_4e8._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__7.message_);
  SVar1 = ot::commissioner::persistent_storage::PersistentStorageJson::Close(&psj);
  gtest_ar__7.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar__7.success_ = SVar1 == kSuccess;
  if (!gtest_ar__7.success_) {
    testing::Message::Message((Message *)&local_4e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_,(internal *)&gtest_ar__7,
               (AssertionResult *)"psj.Close() == PersistentStorage::Status::kSuccess","false",
               "true",pcVar2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_498,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x1a4,(char *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_498,(Message *)&local_4e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_498);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    if ((long *)local_4e8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_4e8._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__7.message_);
  ot::commissioner::persistent_storage::BorderRouter::~BorderRouter(&returnValue);
  ot::commissioner::persistent_storage::PersistentStorageJson::~PersistentStorageJson(&psj);
  return;
}

Assistant:

TEST(PersistentStorageJsonTestSuite, GetBorderRouterNotEmpty)
{
    // Make the test independent
    unlink("./tmp/test.tmp");

    PersistentStorageJson psj("./tmp/test.tmp");

    EXPECT_TRUE(psj.Open() == PersistentStorage::Status::kSuccess);

    BorderRouterId newId;

    EXPECT_TRUE(psj.Add(BorderRouter{EMPTY_ID, EMPTY_ID,
                                     BorderAgent{"1.1.1.2", 11, ByteArray{}, "th1.x", BorderAgent::State{1, 0, 1, 0, 1},
                                                 "NetworkId", 0x1011223344556677ll, "vendor_name", "model_name",
                                                 Timestamp{0, 0, 0}, 1, "vendor_data", ByteArray{1, 2}, "Domain_name",
                                                 0, 0, "", 0, 0xFFFF}},
                        newId) == PersistentStorage::Status::kSuccess);
    EXPECT_TRUE(newId.mId == 0);
    EXPECT_TRUE(psj.Add(BorderRouter{EMPTY_ID, EMPTY_ID,
                                     BorderAgent{"1.1.1.3", 12, ByteArray{}, "th1.x", BorderAgent::State{1, 0, 1, 0, 1},
                                                 "NetworkId", 0x1011223344556677ll, "vendor_name", "model_name",
                                                 Timestamp{0, 0, 0}, 1, "vendor_data", ByteArray{1, 2}, "Domain_name",
                                                 0, 0, "", 0, 0xFFFF}},
                        newId) == PersistentStorage::Status::kSuccess);
    EXPECT_TRUE(newId.mId == 1);
    EXPECT_TRUE(psj.Add(BorderRouter{EMPTY_ID, EMPTY_ID,
                                     BorderAgent{"1.1.1.4", 13, ByteArray{}, "th1.x", BorderAgent::State{1, 0, 1, 0, 1},
                                                 "NetworkId", 0x1011223344556677ll, "vendor_name", "model_name",
                                                 Timestamp{0, 0, 0}, 1, "vendor_data", ByteArray{1, 2}, "Domain_name",
                                                 0, 0, "", 0, 0xFFFF}},
                        newId) == PersistentStorage::Status::kSuccess);
    EXPECT_TRUE(newId.mId == 2);

    BorderRouter returnValue;

    EXPECT_TRUE(psj.Get(BorderRouterId(3), returnValue) == PersistentStorage::Status::kNotFound);
    EXPECT_TRUE(psj.Get(BorderRouterId(1), returnValue) == PersistentStorage::Status::kSuccess);
    EXPECT_TRUE(returnValue.mId.mId == 1);
    EXPECT_TRUE(returnValue.mAgent.mPort == 12);
    EXPECT_TRUE(returnValue.mAgent.mAddr == "1.1.1.3");

    EXPECT_TRUE(psj.Close() == PersistentStorage::Status::kSuccess);
}